

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O3

void __thiscall
btPoint2PointConstraint::setParam(btPoint2PointConstraint *this,int num,btScalar value,int axis)

{
  uint uVar1;
  
  if (axis != -1) {
    return;
  }
  if (num - 3U < 2) {
    this->m_cfm = value;
    uVar1 = 2;
  }
  else {
    if (1 < num - 1U) {
      return;
    }
    this->m_erp = value;
    uVar1 = 1;
  }
  this->m_flags = this->m_flags | uVar1;
  return;
}

Assistant:

void btPoint2PointConstraint::setParam(int num, btScalar value, int axis)
{
	if(axis != -1)
	{
		btAssertConstrParams(0);
	}
	else
	{
		switch(num)
		{
			case BT_CONSTRAINT_ERP :
			case BT_CONSTRAINT_STOP_ERP :
				m_erp = value; 
				m_flags |= BT_P2P_FLAGS_ERP;
				break;
			case BT_CONSTRAINT_CFM :
			case BT_CONSTRAINT_STOP_CFM :
				m_cfm = value; 
				m_flags |= BT_P2P_FLAGS_CFM;
				break;
			default: 
				btAssertConstrParams(0);
		}
	}
}